

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O0

void macro_SetUniqueID(uint32_t id)

{
  uint32_t id_local;
  
  uniqueID = id;
  if ((id == 0) || (id == 0xffffffff)) {
    uniqueIDPtr = (char *)0x0;
  }
  else {
    sprintf(uniqueIDBuf,"_u%u",(ulong)id);
    uniqueIDPtr = uniqueIDBuf;
  }
  return;
}

Assistant:

void macro_SetUniqueID(uint32_t id)
{
	uniqueID = id;
	if (id == 0 || id == (uint32_t)-1) {
		uniqueIDPtr = NULL;
	} else {
		// The buffer is guaranteed to be the correct size
		// This is a valid label fragment, but not a valid numeric
		sprintf(uniqueIDBuf, "_u%" PRIu32, id);
		uniqueIDPtr = uniqueIDBuf;
	}
}